

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * ON_Font::GetManagedFontFromFontDescription(wchar_t *font_description)

{
  bool bVar1;
  ON_Font *pOVar2;
  ON_Font font_characteristics;
  ON_Font local_d0;
  
  ON_Font(&local_d0);
  bVar1 = SetFromFontDescription(&local_d0,font_description);
  if (bVar1) {
    pOVar2 = ManagedFont(&local_d0);
  }
  else {
    pOVar2 = (ON_Font *)0x0;
  }
  ~ON_Font(&local_d0);
  return pOVar2;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromFontDescription(
  const wchar_t* font_description
  )
{
  ON_Font font_characteristics;
  if ( false == font_characteristics.SetFromFontDescription(font_description) )
    return nullptr;
  return font_characteristics.ManagedFont();
}